

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int parse_long_options(char **nargv,char *options,option *long_options,int *idx,int short_too,
                      int flags)

{
  int iVar1;
  char *__s;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  size_t __n;
  char *__s2;
  char *pcVar8;
  option *poVar9;
  long lVar10;
  int local_8c;
  
  __s = place;
  iVar1 = optind;
  if ((ulong)(uint)dash_prefix < 3) {
    pcVar8 = &DAT_0013f51c + *(int *)(&DAT_0013f51c + (ulong)(uint)dash_prefix * 4);
  }
  else {
    pcVar8 = "";
  }
  optind = optind + 1;
  pcVar4 = strchr(place,0x3d);
  if (pcVar4 == (char *)0x0) {
    __n = strlen(__s);
    pcVar4 = (char *)0x0;
  }
  else {
    __n = (long)pcVar4 - (long)__s;
    pcVar4 = pcVar4 + 1;
  }
  __s2 = long_options->name;
  if (__s2 == (char *)0x0) {
LAB_00126954:
    if (short_too != 0) {
      optind = iVar1;
      return -1;
    }
    if ((opterr != 0) && (*options != ':')) {
      warnx("unrecognized option `%s%s\'",pcVar8,__s);
    }
  }
  else {
    local_8c = -1;
    bVar7 = true;
    lVar10 = 0;
    do {
      poVar9 = long_options + lVar10 + 1;
LAB_00126895:
      iVar2 = strncmp(__s,__s2,__n);
      iVar3 = local_8c;
      if (iVar2 != 0) goto LAB_00126901;
      sVar5 = strlen(__s2);
      iVar2 = (int)lVar10;
      if (sVar5 == __n) goto LAB_001269e3;
      if (((__n == 1 && short_too != 0) || (iVar3 = iVar2, local_8c == -1)) ||
         (((flags & 4U) == 0 &&
          (((lVar6 = (long)local_8c, poVar9[-1].has_arg == long_options[lVar6].has_arg &&
            (poVar9[-1].flag == long_options[lVar6].flag)) &&
           (iVar3 = local_8c, poVar9[-1].val == long_options[lVar6].val)))))) goto LAB_00126901;
      lVar10 = lVar10 + 1;
      __s2 = poVar9->name;
      bVar7 = false;
    } while (__s2 != (char *)0x0);
LAB_00126970:
    if ((opterr != 0) && (*options != ':')) {
      warnx("option `%s%.*s\' is ambiguous",pcVar8,__n & 0xffffffff,__s);
    }
  }
  optopt = 0;
  return 0x3f;
LAB_00126901:
  local_8c = iVar3;
  lVar10 = lVar10 + 1;
  __s2 = poVar9->name;
  poVar9 = poVar9 + 1;
  if (__s2 != (char *)0x0) goto LAB_00126895;
  if (!bVar7) goto LAB_00126970;
  iVar2 = local_8c;
  if (local_8c == -1) goto LAB_00126954;
LAB_001269e3:
  iVar3 = long_options[iVar2].has_arg;
  if (pcVar4 != (char *)0x0 && iVar3 == 0) {
    if ((opterr != 0) && (*options != ':')) {
      warnx("option `%s%.*s\' doesn\'t allow an argument",pcVar8,__n & 0xffffffff,__s);
    }
    if (long_options[iVar2].flag != (int *)0x0) {
      optopt = 0;
      return 0x3f;
    }
    optopt = long_options[iVar2].val;
    return 0x3f;
  }
  if (iVar3 - 1U < 2) {
    if (pcVar4 == (char *)0x0) {
      if (iVar3 != 1) goto LAB_00126afa;
      optind = iVar1 + 2;
      iVar3 = long_options[iVar2].has_arg;
      pcVar4 = nargv[(long)iVar1 + 1];
    }
    optarg = pcVar4;
    if ((iVar3 == 1) && (optarg == (char *)0x0)) {
      if ((opterr != 0) && (*options != ':')) {
        warnx("option `%s%s\' requires an argument",pcVar8,__s);
      }
      optopt = 0;
      if (long_options[iVar2].flag == (int *)0x0) {
        optopt = long_options[iVar2].val;
      }
      optind = optind + -1;
      return (uint)(*options != ':') * 5 + 0x3a;
    }
  }
LAB_00126afa:
  if (idx != (int *)0x0) {
    *idx = iVar2;
  }
  if (long_options[iVar2].flag != (int *)0x0) {
    *long_options[iVar2].flag = long_options[iVar2].val;
    return 0;
  }
  return long_options[iVar2].val;
}

Assistant:

static int
parse_long_options(char * const *nargv, const char *options,
	const struct option *long_options, int *idx, int short_too, int flags)
{
	char *current_argv, *has_equal;
#ifdef GNU_COMPATIBLE
	char *current_dash;
#endif
	size_t current_argv_len;
	int i, match, exact_match, second_partial_match;

	current_argv = place;
#ifdef GNU_COMPATIBLE
	switch (dash_prefix) {
		case D_PREFIX:
			current_dash = "-";
			break;
		case DD_PREFIX:
			current_dash = "--";
			break;
		case W_PREFIX:
			current_dash = "-W ";
			break;
		default:
			current_dash = "";
			break;
	}
#endif
	match = -1;
	exact_match = 0;
	second_partial_match = 0;

	optind++;

	if ((has_equal = strchr(current_argv, '=')) != NULL) {
		/* argument found (--option=arg) */
		current_argv_len = (size_t)(has_equal - current_argv);
		has_equal++;
	} else
		current_argv_len = strlen(current_argv);

	for (i = 0; long_options[i].name; i++) {
		/* find matching long option */
		if (strncmp(current_argv, long_options[i].name,
		    current_argv_len))
			continue;

		if (strlen(long_options[i].name) == current_argv_len) {
			/* exact match */
			match = i;
			exact_match = 1;
			break;
		}
		/*
		 * If this is a known short option, don't allow
		 * a partial match of a single character.
		 */
		if (short_too && current_argv_len == 1)
			continue;

		if (match == -1)	/* first partial match */
			match = i;
		else if ((flags & FLAG_LONGONLY) ||
			 long_options[i].has_arg !=
			     long_options[match].has_arg ||
			 long_options[i].flag != long_options[match].flag ||
			 long_options[i].val != long_options[match].val)
			second_partial_match = 1;
	}
	if (!exact_match && second_partial_match) {
		/* ambiguous abbreviation */
		if (PRINT_ERROR)
			warnx(ambig,
#ifdef GNU_COMPATIBLE
			     current_dash,
#endif
			     (int)current_argv_len,
			     current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (match != -1) {		/* option found */
		if (long_options[match].has_arg == no_argument
		    && has_equal) {
			if (PRINT_ERROR)
				warnx(noarg,
#ifdef GNU_COMPATIBLE
				     current_dash,
#endif
				     (int)current_argv_len,
				     current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
#ifdef GNU_COMPATIBLE
			return (BADCH);
#else
			return (BADARG);
#endif
		}
		if (long_options[match].has_arg == required_argument ||
		    long_options[match].has_arg == optional_argument) {
			if (has_equal)
				optarg = has_equal;
			else if (long_options[match].has_arg ==
			    required_argument) {
				/*
				 * optional argument doesn't use next nargv
				 */
				optarg = nargv[optind++];
			}
		}
		if ((long_options[match].has_arg == required_argument)
		    && (optarg == NULL)) {
			/*
			 * Missing argument; leading ':' indicates no error
			 * should be generated.
			 */
			if (PRINT_ERROR)
				warnx(recargstring,
#ifdef GNU_COMPATIBLE
				    current_dash,
#endif
				    current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
			--optind;
			return (BADARG);
		}
	} else {			/* unknown option */
		if (short_too) {
			--optind;
			return (-1);
		}
		if (PRINT_ERROR)
			warnx(illoptstring,
#ifdef GNU_COMPATIBLE
			      current_dash,
#endif
			      current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (idx)
		*idx = match;
	if (long_options[match].flag) {
		*long_options[match].flag = long_options[match].val;
		return (0);
	} else
		return (long_options[match].val);
}